

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask8_8(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  
  uVar1 = in[5];
  uVar2 = in[4];
  uVar3 = in[6];
  *out = in[3] << 0x18 | in[2] << 0x10 | in[1] << 8 | *in;
  out[1] = in[7] << 0x18 | uVar3 << 0x10 | uVar1 << 8 | uVar2;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask8_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;

  return out;
}